

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall HighFreqDataType::HighFreqDataType(HighFreqDataType *this,HighFreqDataType *obj)

{
  long in_RSI;
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__HighFreqDataType_003755b0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  std::__cxx11::string::operator=((string *)(in_RDI + 5),(string *)(in_RSI + 0x28));
  std::__cxx11::string::operator=((string *)(in_RDI + 9),(string *)(in_RSI + 0x48));
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),(string *)(in_RSI + 0x68));
  *(undefined4 *)&in_RDI[0x11]._vptr_NetworkDataType = *(undefined4 *)(in_RSI + 0x88);
  return;
}

Assistant:

HighFreqDataType::HighFreqDataType(const HighFreqDataType &obj) {
    name = obj.name;
    origin = obj.origin;
    dataFormat = obj.dataFormat;
    sockAddr = obj.sockAddr;
    byteSize = obj.byteSize;
}